

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

bool anon_unknown.dwarf_1412e7::checkPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  uint *puVar1;
  half **pphVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  Array2D<half_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar5;
  int in_stack_00000008;
  uint i;
  int x;
  int y;
  half local_36;
  float fVar6;
  float f;
  int iVar7;
  
  do {
    iVar7 = in_EDX;
    if (in_R9D < in_R8D) {
      return true;
    }
    for (; iVar7 <= in_ECX; iVar7 = iVar7 + 1) {
      fVar6 = 0.0;
      while (f = fVar6, puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)in_R8D),
            (uint)fVar6 < puVar1[iVar7]) {
        pphVar2 = Imf_2_5::Array2D<half_*>::operator[](in_RSI,(long)in_R8D);
        fVar6 = half::operator_cast_to_float(pphVar2[iVar7] + (uint)f);
        half::half((half *)CONCAT44(in_R8D,iVar7),f);
        fVar5 = half::operator_cast_to_float(&local_36);
        if ((fVar6 != fVar5) || (NAN(fVar6) || NAN(fVar5))) {
          poVar3 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_R8D);
          poVar3 = std::operator<<(poVar3,", sample ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)f);
          poVar3 = std::operator<<(poVar3,": ");
          pphVar2 = Imf_2_5::Array2D<half_*>::operator[](in_RSI,(long)in_R8D);
          poVar3 = (ostream *)::operator<<(poVar3,(half)pphVar2[iVar7][(uint)f]._h);
          poVar3 = std::operator<<(poVar3,", should be ");
          pvVar4 = (void *)std::ostream::operator<<
                                     (poVar3,(in_R8D * in_stack_00000008 + iVar7) % 0x801);
          pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
          return false;
        }
        fVar6 = (float)((int)f + 1);
      }
    }
    in_R8D = in_R8D + 1;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<unsigned int>& sampleCount,
             Array2D<T*> &ph,
             int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    }

    return true;
}